

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void psr_new_local(Parser *psr,uint64_t name)

{
  int iVar1;
  Local *pLVar2;
  uint64_t name_local;
  Parser *psr_local;
  
  if (psr->locals_capacity <= psr->locals_count) {
    psr->locals_capacity = psr->locals_capacity << 1;
    pLVar2 = (Local *)realloc(psr->locals,(long)psr->locals_capacity << 3);
    psr->locals = pLVar2;
  }
  iVar1 = psr->locals_count;
  psr->locals_count = iVar1 + 1;
  psr->locals[iVar1].name = name;
  return;
}

Assistant:

static void psr_new_local(Parser *psr, uint64_t name) {
	if (psr->locals_count >= psr->locals_capacity) {
		psr->locals_capacity *= 2;
		psr->locals = realloc(psr->locals, sizeof(Local) * psr->locals_capacity);
	}
	psr->locals[psr->locals_count++].name = name;
}